

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wskey.cpp
# Opt level: O0

void __thiscall pstore::http::sha1::pad_message(sha1 *this)

{
  uint64_t uVar1;
  reference pvVar2;
  sha1 *this_local;
  
  if (this->index_ < 0x38) {
    pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,(ulong)this->index_);
    *pvVar2 = 0x80;
    this->index_ = this->index_ + 1;
    while (this->index_ < 0x38) {
      pvVar2 = std::array<unsigned_char,_64UL>::operator[]
                         (&this->message_block_,(ulong)this->index_);
      *pvVar2 = '\0';
      this->index_ = this->index_ + 1;
    }
  }
  else {
    pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,(ulong)this->index_);
    *pvVar2 = 0x80;
    this->index_ = this->index_ + 1;
    while (this->index_ < 0x40) {
      pvVar2 = std::array<unsigned_char,_64UL>::operator[]
                         (&this->message_block_,(ulong)this->index_);
      *pvVar2 = '\0';
      this->index_ = this->index_ + 1;
    }
    process_message_block(this);
    while (this->index_ < 0x38) {
      pvVar2 = std::array<unsigned_char,_64UL>::operator[]
                         (&this->message_block_,(ulong)this->index_);
      *pvVar2 = '\0';
      this->index_ = this->index_ + 1;
    }
  }
  uVar1 = this->length_;
  pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,0x38);
  *pvVar2 = (value_type_conflict2)(uVar1 >> 0x38);
  uVar1 = this->length_;
  pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,0x39);
  *pvVar2 = (value_type_conflict2)(uVar1 >> 0x30);
  uVar1 = this->length_;
  pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,0x3a);
  *pvVar2 = (value_type_conflict2)(uVar1 >> 0x28);
  uVar1 = this->length_;
  pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,0x3b);
  *pvVar2 = (value_type_conflict2)(uVar1 >> 0x20);
  uVar1 = this->length_;
  pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,0x3c);
  *pvVar2 = (value_type_conflict2)(uVar1 >> 0x18);
  uVar1 = this->length_;
  pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,0x3d);
  *pvVar2 = (value_type_conflict2)(uVar1 >> 0x10);
  uVar1 = this->length_;
  pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,0x3e);
  *pvVar2 = (value_type_conflict2)(uVar1 >> 8);
  uVar1 = this->length_;
  pvVar2 = std::array<unsigned_char,_64UL>::operator[](&this->message_block_,0x3f);
  *pvVar2 = (value_type_conflict2)uVar1;
  process_message_block(this);
  return;
}

Assistant:

void sha1::pad_message () noexcept {
            // Note that many of the variable names in this code, especially the single character
            // names, were used because those were the names used in the publication.

            // Check to see if the current message block is too small to hold the initial padding
            // bits and length.  If so, we will pad the block, process it, and then continue padding
            // into a second block.
            if (index_ > 55) {
                message_block_[index_] = 0x80;
                ++index_;

                for (; index_ < 64; ++index_) {
                    message_block_[index_] = 0;
                }

                this->process_message_block ();

                for (; index_ < 56; ++index_) {
                    message_block_[index_] = 0;
                }
            } else {
                message_block_[index_] = 0x80;
                ++index_;
                for (; index_ < 56; ++index_) {
                    message_block_[index_] = 0;
                }
            }

            // Store the message length as the last 8 octets.
            message_block_[56] = static_cast<std::uint8_t> (length_ >> 56U);
            message_block_[57] = static_cast<std::uint8_t> (length_ >> 48U);
            message_block_[58] = static_cast<std::uint8_t> (length_ >> 40U);
            message_block_[59] = static_cast<std::uint8_t> (length_ >> 32U);
            message_block_[60] = static_cast<std::uint8_t> (length_ >> 24U);
            message_block_[61] = static_cast<std::uint8_t> (length_ >> 16U);
            message_block_[62] = static_cast<std::uint8_t> (length_ >> 8U);
            message_block_[63] = static_cast<std::uint8_t> (length_);

            this->process_message_block ();
        }